

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O2

Style * __thiscall
ccs::Dumper::nodeStyle_abi_cxx11_(Style *__return_storage_ptr__,Dumper *this,Node *node)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  ostringstream str;
  allocator local_1f9;
  Style *local_1f8;
  key_type local_1f0;
  Node *local_1d0;
  key_type local_1c8;
  key_type local_1a8 [11];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f8 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)local_1a8,"shape",(allocator *)&local_1f0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,local_1a8);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string((string *)local_1a8,"style",(allocator *)&local_1f0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_1f8,local_1a8);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string((string *)local_1a8,"nodesep",(allocator *)&local_1f0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_1f8,local_1a8);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1d0 = node;
  for (p_Var5 = (node->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pNVar2 = local_1d0,
      (_Rb_tree_header *)p_Var5 != &(node->props)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    if (*(char *)((long)&p_Var5[6]._M_right + 4) == '\x01') {
      std::operator<<((ostream *)local_1a8,"@override ");
    }
    poVar4 = std::operator<<((ostream *)local_1a8,(string *)(p_Var5 + 1));
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,(string *)&p_Var5[3]._M_left);
    std::operator<<(poVar4,"\n");
  }
  if ((local_1d0->constraints).values_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar4 = std::operator<<((ostream *)local_1a8,"@constrain ");
    ccs::operator<<(poVar4,&pNVar2->constraints);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_1c8,"label",&local_1f9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_1f8,&local_1c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_1f0,"fontsize",(allocator *)&local_1c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_1f8,&local_1f0);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return local_1f8;
}

Assistant:

Style Dumper::nodeStyle(const Node &node) const {
  Style style;
  style["shape"] = "box";
  style["style"] = "rounded";
  style["nodesep"] = "2.0";

  std::ostringstream str;
  const auto &props = node.properties();
  for (auto it = props.cbegin(); it != props.cend(); ++it) {
    if (it->second.override()) str << "@override ";
    str << it->first << " = " << it->second.strValue() << "\n";
  }
  if (!node.allConstraints().empty())
    str << "@constrain " << node.allConstraints();
  style["label"] = str.str();
  style["fontsize"] = "9";
  return style;
}